

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O0

void Abc_SclManPrintGateSizes(SC_Lib *pLib,Abc_Ntk_t *p,Vec_Int_t *vGates)

{
  int iVar1;
  int iVar2;
  uint i_00;
  Abc_Obj_t *pObj_00;
  SC_Cell *pSVar3;
  double local_348;
  double Areas [64];
  double local_140;
  double TotArea;
  int Counters [64];
  int nGates;
  int i;
  SC_Cell *pCell;
  Abc_Obj_t *pObj;
  Vec_Int_t *vGates_local;
  Abc_Ntk_t *p_local;
  SC_Lib *pLib_local;
  
  Counters[0x3e] = 0;
  memset(&TotArea,0,0x100);
  local_140 = 0.0;
  memset(&local_348,0,0x200);
  Counters[0x3f] = 0;
  do {
    iVar2 = Counters[0x3f];
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= iVar2) {
      printf("Total gates = %d.  Total area = %.1f\n",local_140,(ulong)(uint)Counters[0x3e]);
      for (Counters[0x3f] = 0; Counters[0x3f] < 0x40; Counters[0x3f] = Counters[0x3f] + 1) {
        if (Counters[(long)Counters[0x3f] + -2] != 0) {
          printf("Cell size = %d.  ",(ulong)(uint)Counters[0x3f]);
          printf("Count = %6d  ",(ulong)(uint)Counters[(long)Counters[0x3f] + -2]);
          printf("(%5.1f %%)   ",
                 ((double)Counters[(long)Counters[0x3f] + -2] * 100.0) / (double)Counters[0x3e]);
          printf("Area = %12.1f  ",Areas[(long)Counters[0x3f] + -1]);
          printf("(%5.1f %%)  ",(Areas[(long)Counters[0x3f] + -1] * 100.0) / local_140);
          printf("\n");
        }
      }
      return;
    }
    pObj_00 = Abc_NtkObj(p,Counters[0x3f]);
    if ((((pObj_00 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pObj_00), iVar2 != 0)) &&
        (iVar2 = Abc_ObjFaninNum(pObj_00), iVar2 != 0)) &&
       (iVar2 = Abc_ObjIsBarBuf(pObj_00), iVar2 == 0)) {
      i_00 = Abc_ObjId(pObj_00);
      iVar2 = Vec_IntEntry(vGates,i_00);
      pSVar3 = SC_LibCell(pLib,iVar2);
      if (0x3f < pSVar3->Order) {
        __assert_fail("pCell->Order < ABC_SCL_MAX_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                      ,0x89,"void Abc_SclManPrintGateSizes(SC_Lib *, Abc_Ntk_t *, Vec_Int_t *)");
      }
      Counters[(long)pSVar3->Order + -2] = Counters[(long)pSVar3->Order + -2] + 1;
      Areas[(long)pSVar3->Order + -1] = (double)pSVar3->area + Areas[(long)pSVar3->Order + -1];
      local_140 = (double)pSVar3->area + local_140;
      Counters[0x3e] = Counters[0x3e] + 1;
    }
    Counters[0x3f] = Counters[0x3f] + 1;
  } while( true );
}

Assistant:

void Abc_SclManPrintGateSizes( SC_Lib * pLib, Abc_Ntk_t * p, Vec_Int_t * vGates )
{
    Abc_Obj_t * pObj;
    SC_Cell * pCell;
    int i, nGates = 0, Counters[ABC_SCL_MAX_SIZE] = {0};
    double TotArea = 0, Areas[ABC_SCL_MAX_SIZE] = {0};
    Abc_NtkForEachNodeNotBarBuf1( p, pObj, i )
    {
        pCell = SC_LibCell( pLib, Vec_IntEntry(vGates, Abc_ObjId(pObj)) );
        assert( pCell->Order < ABC_SCL_MAX_SIZE );
        Counters[pCell->Order]++;
        Areas[pCell->Order] += pCell->area;
        TotArea += pCell->area;
        nGates++;
    }
    printf( "Total gates = %d.  Total area = %.1f\n", nGates, TotArea );
    for ( i = 0; i < ABC_SCL_MAX_SIZE; i++ )
    {
        if ( Counters[i] == 0 )
            continue;
        printf( "Cell size = %d.  ", i );
        printf( "Count = %6d  ",     Counters[i] );
        printf( "(%5.1f %%)   ",     100.0 * Counters[i] / nGates );
        printf( "Area = %12.1f  ",   Areas[i] );
        printf( "(%5.1f %%)  ",      100.0 * Areas[i] / TotArea );
        printf( "\n" );
    }
}